

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool P_LookForPlayers(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  AActor *pAVar4;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar5;
  AActor *pAVar6;
  byte bVar7;
  int iVar8;
  long *plVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  
  if (params == (FLookExParams *)0x0) {
    bVar7 = 0;
  }
  else {
    bVar7 = ((byte)params->flags & 4) >> 2;
  }
  if (actor->TIDtoHate == 0) {
    if (((actor->flags).Value & 0x8000000) != 0) {
      bVar2 = P_LookForEnemies(actor,allaround,params);
      if (actor->FriendPlayer == '\0') {
        if (teamplay.Value == true) {
          iVar8 = AActor::GetTeam(actor);
          if (iVar8 != 0xff && !bVar2) goto LAB_003ef574;
          bVar2 = bVar2 || iVar8 != 0xff;
        }
LAB_003ef570:
        bVar11 = false;
      }
      else {
        if (bVar2) {
          bVar2 = true;
          goto LAB_003ef570;
        }
LAB_003ef574:
        bVar11 = deathmatch.Value != 0;
        bVar2 = true;
      }
      if (!bVar11) {
        return bVar2;
      }
    }
  }
  else {
    bVar2 = P_LookForTID(actor,allaround,params);
    if (bVar2) {
      return true;
    }
    if (-1 < (int)(actor->flags3).Value) {
      return false;
    }
  }
  if (((((undefined1)gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) && (multiplayer == false)
      ) && (DAT_017e5ee8 < 1)) {
    pAVar4 = (actor->goal).field_0.p;
    bVar2 = true;
    if (pAVar4 != (AActor *)0x0) {
      if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        bVar2 = false;
      }
      else {
        (actor->goal).field_0.p = (AActor *)0x0;
      }
    }
    if ((bVar2) && (gamestate != GS_TITLELEVEL)) {
      bVar2 = P_LookForMonsters(actor);
      return bVar2;
    }
  }
  if (actor->TIDtoHate == 0) {
    uVar10 = (ulong)(byte)actor->LastLookPlayerNumber;
  }
  else {
    uVar3 = FRandom::GenRand32(&pr_look2);
    uVar10 = (ulong)uVar3;
  }
  iVar8 = 8;
  do {
    uVar3 = (int)uVar10 + 1U & 7;
    uVar10 = (ulong)uVar3;
    if (playeringame[uVar10] != false) {
      if (actor->TIDtoHate == 0) {
        actor->LastLookPlayerNumber = (SBYTE)uVar3;
      }
      if ((((((((AActor *)(&players)[uVar10 * 0x54])->flags).Value & 4) != 0) &&
           (plVar9 = &players + uVar10 * 0x54, (*(byte *)(&DAT_017e5f38 + uVar10 * 0xa8) & 8) == 0))
          && ((0 < (&DAT_017e5ee8)[uVar10 * 0xa8] &&
              (bVar2 = P_IsVisible(actor,(AActor *)(&players)[uVar10 * 0x54],allaround,params),
              bVar2)))) &&
         (((((actor->flags).Value & 0x8000000) == 0 ||
           (bVar2 = AActor::IsFriend(actor,(AActor *)*plVar9), !bVar2)) &&
          ((((actor->flags6).Value & 0x1000000) != 0 ||
           ((((pAVar4 = (AActor *)*plVar9, ((pAVar4->flags).Value & 0x40000) == 0 ||
              ((i_compatflags._2_1_ & 1) != 0)) && (((pAVar4->flags3).Value & 8) == 0)) ||
            (((dVar12 = AActor::Distance2D(pAVar4,actor,false), dVar12 <= 128.0 ||
              (dVar12 = *(double *)(*plVar9 + 200), dVar1 = *(double *)(*plVar9 + 0xd0),
              25.0 <= dVar1 * dVar1 + dVar12 * dVar12)) &&
             (uVar3 = FRandom::GenRand32(&pr_lookforplayers), 0xe0 < (uVar3 & 0xff))))))))))) {
        pAVar4 = (actor->goal).field_0.p;
        if (pAVar4 != (AActor *)0x0) {
          if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            pAVar4 = (actor->goal).field_0.p;
            if ((pAVar4 != (AActor *)0x0) &&
               (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (actor->goal).field_0.p = (AActor *)0x0;
              pAVar4 = (AActor *)0x0;
            }
            pAVar6 = (actor->target).field_0.p;
            if ((pAVar6 != (AActor *)0x0) &&
               (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (actor->target).field_0.p = (AActor *)0x0;
              pAVar6 = (AActor *)0x0;
            }
            if (pAVar6 == pAVar4) {
              actor->reactiontime = 0;
            }
          }
          else {
            (actor->goal).field_0.p = (AActor *)0x0;
          }
        }
        aVar5.p = (AActor *)*plVar9;
        goto LAB_003ef93a;
      }
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  pAVar4 = (actor->target).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003ef7f4;
    (actor->target).field_0.p = (AActor *)0x0;
  }
  pAVar4 = (actor->goal).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (bVar7 == 0) {
        aVar5 = (actor->goal).field_0;
LAB_003ef93a:
        (actor->target).field_0 = aVar5;
        return true;
      }
    }
    else {
      (actor->goal).field_0.p = (AActor *)0x0;
    }
  }
  pAVar4 = (actor->lastenemy).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((actor->lastenemy).field_0.p)->health < 1) goto LAB_003ef7f4;
      pAVar4 = (actor->lastenemy).field_0.p;
      if ((pAVar4 != (AActor *)0x0) &&
         (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (actor->lastenemy).field_0.p = (AActor *)0x0;
        pAVar4 = (AActor *)0x0;
      }
      bVar2 = AActor::IsFriend(actor,pAVar4);
      if (!bVar2) {
        (actor->target).field_0 = (actor->lastenemy).field_0;
        (actor->lastenemy).field_0.p = (AActor *)0x0;
        return true;
      }
    }
    (actor->lastenemy).field_0.p = (AActor *)0x0;
  }
LAB_003ef7f4:
  pAVar4 = (actor->goal).field_0.p;
  if ((pAVar4 != (AActor *)0x0) &&
     (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->goal).field_0.p = (AActor *)0x0;
    pAVar4 = (AActor *)0x0;
  }
  pAVar6 = (actor->target).field_0.p;
  if ((pAVar6 != (AActor *)0x0) &&
     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (actor->target).field_0.p = (AActor *)0x0;
    pAVar6 = (AActor *)0x0;
  }
  if ((pAVar6 == pAVar4) && (pAVar4 = (actor->goal).field_0.p, pAVar4 != (AActor *)0x0)) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      return true;
    }
    (actor->goal).field_0.p = (AActor *)0x0;
  }
  return false;
}

Assistant:

bool P_LookForPlayers (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	int 		c;
	int			pnum;
	player_t*	player;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	if (actor->TIDtoHate != 0)
	{
		if (P_LookForTID (actor, allaround, params))
		{
			return true;
		}
		if (!(actor->flags3 & MF3_HUNTPLAYERS))
		{
			return false;
		}
	}
	else if (actor->flags & MF_FRIENDLY)
	{
		bool result = P_LookForEnemies (actor, allaround, params);

#ifdef MBF_FRIENDS
		if (!result && (actor->flags & MF_FRIEND_MBF))
		{  // killough 9/9/98: friendly monsters go about players differently

			// Go back to a player, no matter whether it's visible or not
			for (int anyone=0; anyone<=1; anyone++)
			{
				for (int c=0; c<MAXPLAYERS; c++)
				{
					if (playeringame[c] && players[c].playerstate==PST_LIVE &&
						actor->IsFriend(players[c].mo) &&
						(anyone || P_IsVisible(actor, players[c].mo, allaround)))
					{
						actor->target = players[c].mo;

						// killough 12/98:
						// get out of refiring loop, to avoid hitting player accidentally

						if (actor->MissileState != NULL)
						{
							actor->SetState(actor->SeeState, true);
							actor->flags &= ~MF_JUSTHIT;
						}

						return true;
					}
				}
			}
		}
#endif
		// [SP] If you don't see any enemies in deathmatch, look for players (but only when friend to a specific player.)
		if (actor->FriendPlayer == 0 && (!teamplay || actor->GetTeam() == TEAM_NONE)) return result;
		if (result || !deathmatch) return true;


	}	// [SP] if false, and in deathmatch, intentional fall-through

	if (!(gameinfo.gametype & (GAME_DoomStrifeChex)) &&
		!multiplayer &&
		players[0].health <= 0 && 
		actor->goal == NULL &&
		gamestate != GS_TITLELEVEL
		)
	{ // Single player game and player is dead; look for monsters
		return P_LookForMonsters (actor);
	}

	c = 0;
	if (actor->TIDtoHate != 0)
	{
		pnum = pr_look2() & (MAXPLAYERS-1);
	}
	else
	{
		pnum = actor->LastLookPlayerNumber;
	}
		
	for (;;)
	{
		// [ED850] Each and every player should only ever be checked once.
		if (c++ < MAXPLAYERS)
		{
			pnum = (pnum + 1) & (MAXPLAYERS - 1);
			if (!playeringame[pnum])
				continue;

			if (actor->TIDtoHate == 0)
			{
				actor->LastLookPlayerNumber = pnum;
			}
		}
		else
		{
			// done looking
			if (actor->target == NULL)
			{
				// [RH] use goal as target
				// [KS] ...unless we're ignoring goals and we don't already have one
				if (actor->goal != NULL && chasegoal)
				{
					actor->target = actor->goal;
					return true;
				}
				// Use last known enemy if no players sighted -- killough 2/15/98:
				if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
				{
					if (!actor->IsFriend(actor->lastenemy))
					{
						actor->target = actor->lastenemy;
						actor->lastenemy = NULL;
						return true;
					}
					else
					{
						actor->lastenemy = NULL;
					}
				}
			}
			return actor->target == actor->goal && actor->goal != NULL;
		}

		player = &players[pnum];

		if (!(player->mo->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (player->cheats & CF_NOTARGET)
			continue;			// no target

		if (player->health <= 0)
			continue;			// dead

		if (!P_IsVisible (actor, player->mo, allaround, params))
			continue;			// out of sight

		// [SP] Deathmatch fixes - if we have MF_FRIENDLY we're definitely in deathmatch
		// We're going to ignore our master, but go after his enemies.
		if ( actor->flags & MF_FRIENDLY )
		{
			if ( actor->IsFriend(player->mo) )
				continue;
		}

		// [RC] Well, let's let special monsters with this flag active be able to see
		// the player then, eh?
		if(!(actor->flags6 & MF6_SEEINVISIBLE)) 
		{
			if ((player->mo->flags & MF_SHADOW && !(i_compatflags & COMPATF_INVISIBILITY)) ||
				player->mo->flags3 & MF3_GHOST)
			{
				if (player->mo->Distance2D (actor) > 128 && player->mo->Vel.XY().LengthSquared() < 5*5)
				{ // Player is sneaking - can't detect
					continue;
				}
				if (pr_lookforplayers() < 225)
				{ // Player isn't sneaking, but still didn't detect
					continue;
				}
			}
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after a player.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = player->mo;
		return true;
	}
}